

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  CRef CVar1;
  int iVar2;
  int iVar3;
  Size SVar4;
  uint32_t uVar5;
  uint *cr_00;
  Clause *this_00;
  CRef local_34;
  int local_30;
  CRef cr;
  int i_1;
  int j;
  vec<unsigned_int,_int> *cs;
  ClauseAllocator *pCStack_18;
  int i;
  ClauseAllocator *to_local;
  SimpSolver *this_local;
  
  if ((this->use_simplification & 1U) != 0) {
    pCStack_18 = to;
    to_local = (ClauseAllocator *)this;
    for (cs._4_4_ = 0; iVar2 = cs._4_4_, iVar3 = Solver::nVars(&this->super_Solver), iVar2 < iVar3;
        cs._4_4_ = cs._4_4_ + 1) {
      OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
      ::clean(&this->occurs,(int *)((long)&cs + 4));
      _i_1 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
             ::operator[](&this->occurs,(int *)((long)&cs + 4));
      for (cr = 0; CVar1 = cr, SVar4 = vec<unsigned_int,_int>::size(_i_1), (int)CVar1 < SVar4;
          cr = cr + 1) {
        cr_00 = vec<unsigned_int,_int>::operator[](_i_1,cr);
        ClauseAllocator::reloc(&(this->super_Solver).ca,cr_00,pCStack_18);
      }
    }
    for (local_30 = Queue<unsigned_int>::size(&this->subsumption_queue); 0 < local_30;
        local_30 = local_30 + -1) {
      local_34 = Queue<unsigned_int>::peek(&this->subsumption_queue);
      Queue<unsigned_int>::pop(&this->subsumption_queue);
      this_00 = ClauseAllocator::operator[](&(this->super_Solver).ca,local_34);
      uVar5 = Clause::mark(this_00);
      if (uVar5 == 0) {
        ClauseAllocator::reloc(&(this->super_Solver).ca,&local_34,pCStack_18);
        Queue<unsigned_int>::insert(&this->subsumption_queue,local_34);
      }
    }
    ClauseAllocator::reloc(&(this->super_Solver).ca,&this->bwdsub_tmpunit,pCStack_18);
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator& to)
{
    if (!use_simplification) return;

    // All occurs lists:
    //
    for (int i = 0; i < nVars(); i++){
        occurs.clean(i);
        vec<CRef>& cs = occurs[i];
        for (int j = 0; j < cs.size(); j++)
            ca.reloc(cs[j], to);
    }

    // Subsumption queue:
    //
    for (int i = subsumption_queue.size(); i > 0; i--){
        CRef cr = subsumption_queue.peek(); subsumption_queue.pop();
        if (ca[cr].mark()) continue;
        ca.reloc(cr, to);
        subsumption_queue.insert(cr);
    }
        
    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}